

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O1

StackFrame * __thiscall
moira::Moira::makeFrame<0ull>(StackFrame *__return_storage_ptr__,Moira *this,u32 addr)

{
  ushort uVar1;
  u32 uVar2;
  byte bVar3;
  u16 uVar4;
  
  uVar2 = (this->reg).pc;
  uVar4 = getSR(this);
  uVar1 = (this->queue).ird;
  bVar3 = readFC(this);
  __return_storage_ptr__->code = (ushort)bVar3 | uVar1 & 0xffe0 | 0x10;
  __return_storage_ptr__->addr = addr;
  __return_storage_ptr__->ird = uVar1;
  __return_storage_ptr__->sr = uVar4;
  __return_storage_ptr__->pc = uVar2;
  bVar3 = readFC(this);
  __return_storage_ptr__->fc = (ushort)bVar3;
  __return_storage_ptr__->ssw = (ushort)bVar3;
  return __return_storage_ptr__;
}

Assistant:

StackFrame
Moira::makeFrame(u32 addr)
{
    return makeFrame<F>(addr, getPC(), getSR(), getIRD());
}